

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fio_reap_children(void)

{
  int iVar1;
  __pid_t _Var2;
  int *piVar3;
  int iVar4;
  sigaction sa;
  sigaction local_a0;
  
  if (fio_old_sig_chld.__sigaction_handler.sa_handler == (__sighandler_t)0x0) {
    local_a0.__sigaction_handler.sa_handler = reap_child_handler;
    sigemptyset(&local_a0.sa_mask);
    local_a0.sa_flags = 0x10000001;
    iVar4 = 0x11;
    iVar1 = sigaction(0x11,&local_a0,(sigaction *)&fio_old_sig_chld);
    if (iVar1 == -1) {
      fio_reap_children_cold_1();
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      do {
        _Var2 = waitpid(-1,(int *)0x0,1);
      } while (0 < _Var2);
      *piVar3 = iVar1;
      if (fio_old_sig_chld.__sigaction_handler.sa_handler < (__sighandler_t)0x2) {
        return;
      }
      (*fio_old_sig_chld.__sigaction_handler.sa_handler)(iVar4);
      return;
    }
  }
  return;
}

Assistant:

void fio_reap_children(void) {
  struct sigaction sa;
  if (fio_old_sig_chld.sa_handler)
    return;
  sa.sa_handler = reap_child_handler;
  sigemptyset(&sa.sa_mask);
  sa.sa_flags = SA_RESTART | SA_NOCLDSTOP;
  if (sigaction(SIGCHLD, &sa, &fio_old_sig_chld) == -1) {
    perror("Child reaping initialization failed");
    kill(0, SIGINT);
    exit(errno);
  }
}